

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTextUsage.cpp
# Opt level: O2

EStatusCode RunCFFTest(char **argv,bool inEmbedFonts)

{
  EStatusCode EVar1;
  EncryptionOptions *pEVar2;
  PDFPage *this;
  PageContentContext *inPageContext;
  PDFUsedFont *pPVar3;
  undefined7 in_register_00000031;
  char *__s;
  allocator<char> local_103a;
  allocator<char> local_1039;
  undefined1 local_1038 [48];
  PDFCreationSettings local_1008;
  string local_fa8;
  string local_f88;
  string local_f68;
  string local_f48;
  EncryptionOptions local_f28;
  PDFWriter pdfWriter;
  
  PDFWriter::PDFWriter(&pdfWriter);
  __s = "SimpleTextUsageCFFNoEmbed.pdf";
  if ((int)CONCAT71(in_register_00000031,inEmbedFonts) != 0) {
    __s = "SimpleTextUsageCFF.pdf";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f48,__s,&local_1039);
  BuildRelativeOutputPath(&local_fa8,argv,&local_f48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f88,"SimpleTextUsage.log",&local_103a);
  BuildRelativeOutputPath(&local_f68,argv,&local_f88);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_1038,true,true,&local_f68);
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_f28,pEVar2);
  PDFCreationSettings::PDFCreationSettings(&local_1008,true,inEmbedFonts,&local_f28,false);
  EVar1 = PDFWriter::StartPDF(&pdfWriter,&local_fa8,ePDFVersion13,(LogConfiguration *)local_1038,
                              &local_1008);
  EncryptionOptions::~EncryptionOptions(&local_1008.DocumentEncryptionOptions);
  EncryptionOptions::~EncryptionOptions(&local_f28);
  std::__cxx11::string::~string((string *)(local_1038 + 8));
  std::__cxx11::string::~string((string *)&local_f68);
  std::__cxx11::string::~string((string *)&local_f88);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::__cxx11::string::~string((string *)&local_f48);
  if (EVar1 == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    PDFRectangle::PDFRectangle((PDFRectangle *)&local_1008,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)&local_1008);
    PDFRectangle::~PDFRectangle((PDFRectangle *)&local_1008);
    inPageContext = PDFWriter::StartPageContentContext(&pdfWriter,this);
    if (inPageContext == (PageContentContext *)0x0) {
      std::operator<<((ostream *)&std::cout,"failed to create content context for page\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1038,"fonts/BrushScriptStd.otf",(allocator<char> *)&local_fa8);
      BuildRelativeInputPath((string *)&local_1008,argv,(string *)local_1038);
      pPVar3 = PDFWriter::GetFontForFile(&pdfWriter,(string *)&local_1008,0);
      std::__cxx11::string::~string((string *)&local_1008);
      std::__cxx11::string::~string((string *)local_1038);
      if (pPVar3 == (PDFUsedFont *)0x0) {
        std::operator<<((ostream *)&std::cout,
                        "Failed to create font object for brushscriptstd.otf\n");
      }
      else {
        AbstractContentContext::BT(&inPageContext->super_AbstractContentContext);
        AbstractContentContext::k(&inPageContext->super_AbstractContentContext,0.0,0.0,0.0,1.0);
        AbstractContentContext::Tf(&inPageContext->super_AbstractContentContext,pPVar3,1.0);
        AbstractContentContext::Tm
                  (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1008,"abcd",(allocator<char> *)local_1038);
        EVar1 = AbstractContentContext::Tj
                          (&inPageContext->super_AbstractContentContext,(string *)&local_1008);
        std::__cxx11::string::~string((string *)&local_1008);
        if (EVar1 != eSuccess) {
          std::operator<<((ostream *)&std::cout,
                          "Could not find some of the glyphs for this font (BrushScriptStd)");
        }
        AbstractContentContext::ET(&inPageContext->super_AbstractContentContext);
        AbstractContentContext::BT(&inPageContext->super_AbstractContentContext);
        AbstractContentContext::k(&inPageContext->super_AbstractContentContext,0.0,0.0,0.0,1.0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1038,"fonts/KozGoPro-Regular.otf",(allocator<char> *)&local_fa8);
        BuildRelativeInputPath((string *)&local_1008,argv,(string *)local_1038);
        pPVar3 = PDFWriter::GetFontForFile(&pdfWriter,(string *)&local_1008,0);
        std::__cxx11::string::~string((string *)&local_1008);
        std::__cxx11::string::~string((string *)local_1038);
        if (pPVar3 != (PDFUsedFont *)0x0) {
          AbstractContentContext::Tf(&inPageContext->super_AbstractContentContext,pPVar3,1.0);
          AbstractContentContext::Tm
                    (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,400.8997
                    );
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1008,"abcd",(allocator<char> *)local_1038);
          EVar1 = AbstractContentContext::Tj
                            (&inPageContext->super_AbstractContentContext,(string *)&local_1008);
          std::__cxx11::string::~string((string *)&local_1008);
          if (EVar1 != eSuccess) {
            std::operator<<((ostream *)&std::cout,
                            "Could not find some of the glyphs for this font (Kozuka)");
          }
          AbstractContentContext::ET(&inPageContext->super_AbstractContentContext);
          EVar1 = PDFWriter::EndPageContentContext(&pdfWriter,inPageContext);
          if (EVar1 == eSuccess) {
            EVar1 = PDFWriter::WritePageAndRelease(&pdfWriter,this);
            if (EVar1 == eSuccess) {
              EVar1 = PDFWriter::EndPDF(&pdfWriter);
              if (EVar1 == eSuccess) {
                EVar1 = eSuccess;
              }
              else {
                std::operator<<((ostream *)&std::cout,"failed in end PDF\n");
              }
            }
            else {
              std::operator<<((ostream *)&std::cout,"failed to write page\n");
            }
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed to end page content context\n");
          }
          goto LAB_00143a9a;
        }
        std::operator<<((ostream *)&std::cout,
                        "Failed to create font object for KozGoPro-Regular.otf\n");
      }
    }
    EVar1 = eFailure;
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start PDF\n");
  }
LAB_00143a9a:
  PDFWriter::~PDFWriter(&pdfWriter);
  return EVar1;
}

Assistant:

static EStatusCode RunCFFTest(char* argv[],bool inEmbedFonts)
{
	PDFWriter pdfWriter;
	EStatusCode status; 

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv, inEmbedFonts ? "SimpleTextUsageCFF.pdf" : "SimpleTextUsageCFFNoEmbed.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,
                                                     BuildRelativeOutputPath(argv,"SimpleTextUsage.log")),
													 PDFCreationSettings(true, inEmbedFonts));
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start PDF\n";
			break;
		}	

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);
		if(NULL == contentContext)
		{
			status = PDFHummus::eFailure;
			cout<<"failed to create content context for page\n";
			break;
		}

		PDFUsedFont* font = pdfWriter.GetFontForFile(
                                                     BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/BrushScriptStd.otf"));
		if(!font)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font object for brushscriptstd.otf\n";
			break;
		}

		// Draw some text
		contentContext->BT();
		contentContext->k(0,0,0,1);

		contentContext->Tf(font,1);

		contentContext->Tm(30,0,0,30,78.4252,662.8997);

		EStatusCode encodingStatus = contentContext->Tj("abcd");
		if(encodingStatus != PDFHummus::eSuccess)
			cout<<"Could not find some of the glyphs for this font (BrushScriptStd)";

		// continue even if failed...want to see how it looks like
		contentContext->ET();

		// now write some more text with kozuka font
		contentContext->BT();
		contentContext->k(0,0,0,1);

		PDFUsedFont* fontK = pdfWriter.GetFontForFile(
                                                      BuildRelativeInputPath(
                                                                             argv,
                                                                             "fonts/KozGoPro-Regular.otf"));
		if(!fontK)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font object for KozGoPro-Regular.otf\n";
			break;
		}

		contentContext->Tf(fontK,1);

		contentContext->Tm(30,0,0,30,78.4252,400.8997);

		encodingStatus = contentContext->Tj("abcd");
		if(encodingStatus != PDFHummus::eSuccess)
			cout<<"Could not find some of the glyphs for this font (Kozuka)";

		// continue even if failed...want to see how it looks like
		contentContext->ET();

		status = pdfWriter.EndPageContentContext(contentContext);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end PDF\n";
			break;
		}
	}while(false);
	return status;	

}